

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getsockname.c
# Opt level: O2

int run_test_getsockname_udp(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  size_t sStack_30;
  sockaddr sockname;
  int local_14;
  sockaddr_in addr;
  
  loop = uv_default_loop();
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&addr);
  if (iVar1 != 0) {
    pcVar4 = "0 == uv_ip4_addr(\"0.0.0.0\", server_port, &addr)";
    uVar3 = 0x115;
LAB_0012d86d:
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getsockname.c"
            ,uVar3,pcVar4);
    abort();
  }
  iVar1 = uv_udp_init(loop,&udpServer);
  if (iVar1 == 0) {
    iVar1 = uv_udp_bind(&udpServer,(sockaddr *)&addr,0);
    if (iVar1 == 0) {
      sockname.sa_data[6] = -1;
      sockname.sa_data[7] = -1;
      sockname.sa_data[8] = -1;
      sockname.sa_data[9] = -1;
      sockname.sa_family = 0xffff;
      sockname.sa_data[0] = -1;
      sockname.sa_data[1] = -1;
      sockname.sa_data[2] = -1;
      sockname.sa_data[3] = -1;
      sockname.sa_data[4] = -1;
      sockname.sa_data[5] = -1;
      sockname.sa_data[10] = -1;
      sockname.sa_data[0xb] = -1;
      sockname.sa_data[0xc] = -1;
      sockname.sa_data[0xd] = -1;
      local_14 = 0x10;
      iVar1 = uv_udp_getsockname(&udpServer,&sockname,&local_14);
      if (iVar1 == 0) {
        check_sockname(&sockname,"0.0.0.0",0x23a3,"udp listener socket");
        getsocknamecount = getsocknamecount + 1;
        iVar1 = uv_udp_recv_start(&udpServer,alloc,udp_recv);
        if (iVar1 == 0) {
          iVar1 = uv_udp_init(loop,&udp);
          if (iVar1 == 0) {
            sockname = (sockaddr)uv_buf_init("PING",4);
            iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
            if (iVar1 == 0) {
              iVar1 = uv_udp_send(&send_req,&udp,(uv_buf_t *)&sockname,1,(sockaddr *)&addr,udp_send)
              ;
              if (iVar1 == 0) {
                uv_run(loop,UV_RUN_DEFAULT);
                if (getsocknamecount == 2) {
                  if (udp.send_queue_size == 0) {
                    if (udpServer.send_queue_size == 0) {
                      puVar2 = uv_default_loop();
                      close_loop(puVar2);
                      puVar2 = uv_default_loop();
                      iVar1 = uv_loop_close(puVar2);
                      if (iVar1 == 0) {
                        return 0;
                      }
                      pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                      uVar3 = 0x167;
                    }
                    else {
                      pcVar4 = "udpServer.send_queue_size == 0";
                      uVar3 = 0x165;
                    }
                  }
                  else {
                    pcVar4 = "udp.send_queue_size == 0";
                    uVar3 = 0x164;
                  }
                }
                else {
                  pcVar4 = "getsocknamecount == 2";
                  uVar3 = 0x162;
                }
              }
              else {
                pcVar4 = "!r";
                uVar3 = 0x142;
              }
            }
            else {
              pcVar4 = "0 == uv_ip4_addr(\"127.0.0.1\", server_port, &server_addr)";
              uVar3 = 0x13a;
            }
          }
          else {
            pcVar4 = "!r";
            uVar3 = 0x137;
          }
        }
        else {
          pcVar4 = "r == 0";
          uVar3 = 299;
        }
      }
      else {
        pcVar4 = "r == 0";
        uVar3 = 0x126;
      }
      goto LAB_0012d86d;
    }
    pcVar4 = "Bind error\n";
    sStack_30 = 0xb;
  }
  else {
    pcVar4 = "Socket creation error\n";
    sStack_30 = 0x16;
  }
  fwrite(pcVar4,sStack_30,1,_stderr);
  return 1;
}

Assistant:

TEST_IMPL(getsockname_udp) {
  loop = uv_default_loop();

  if (udp_listener())
    return 1;

  udp_sender();

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(getsocknamecount == 2);

  ASSERT(udp.send_queue_size == 0);
  ASSERT(udpServer.send_queue_size == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}